

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Tree_Item.cxx
# Opt level: O0

Fl_Tree_Item * __thiscall Fl_Tree_Item::next_visible(Fl_Tree_Item *this,Fl_Tree_Prefs *prefs)

{
  int iVar1;
  Fl_Tree_Item *local_28;
  Fl_Tree_Item *item;
  Fl_Tree_Prefs *prefs_local;
  Fl_Tree_Item *this_local;
  
  local_28 = this;
  do {
    local_28 = next(local_28);
    if (local_28 == (Fl_Tree_Item *)0x0) {
      return (Fl_Tree_Item *)0x0;
    }
    iVar1 = is_root(local_28);
  } while (((iVar1 != 0) && (iVar1 = Fl_Tree_Prefs::showroot(prefs), iVar1 == 0)) ||
          (iVar1 = visible_r(local_28), iVar1 == 0));
  return local_28;
}

Assistant:

Fl_Tree_Item *Fl_Tree_Item::next_visible(Fl_Tree_Prefs &prefs) {
  Fl_Tree_Item *item = this;
  while ( 1 ) {
    item = item->next();
    if ( !item ) return 0;
    if ( item->is_root() && !prefs.showroot() ) continue;
    if ( item->visible_r() ) return(item);
  }
}